

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::GetTargetFilePath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *name,string *config)

{
  bool bVar1;
  ulong uVar2;
  cmAlphaNum local_d8;
  cmAlphaNum local_a8;
  string local_78;
  undefined4 local_58;
  undefined1 local_48 [8];
  string path;
  string *config_local;
  string *name_local;
  cmNinjaTargetGenerator *this_local;
  
  path.field_2._8_8_ = config;
  (*(this->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[4])(local_48,this,config);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,".");
    if (!bVar1) {
      cmAlphaNum::cmAlphaNum(&local_a8,'/');
      cmAlphaNum::cmAlphaNum(&local_d8,name);
      cmStrCat<>(&local_78,&local_a8,&local_d8);
      std::__cxx11::string::operator+=((string *)local_48,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_48);
      goto LAB_003cee64;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
LAB_003cee64:
  local_58 = 1;
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetTargetFilePath(
  const std::string& name, const std::string& config) const
{
  std::string path = this->GetTargetOutputDir(config);
  if (path.empty() || path == ".") {
    return name;
  }
  path += cmStrCat('/', name);
  return path;
}